

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

wchar_t parse_digest(archive_read *a,archive_entry *entry,char *digest,wchar_t type)

{
  wchar_t wVar1;
  wchar_t wVar2;
  size_t sVar3;
  ulong local_98;
  size_t len;
  size_t j;
  size_t i;
  wchar_t low;
  wchar_t high;
  uchar digest_buf [64];
  wchar_t type_local;
  char *digest_local;
  archive_entry *entry_local;
  archive_read *a_local;
  
  switch(type) {
  case L'\x01':
    local_98 = 0x10;
    break;
  case L'\x02':
    local_98 = 0x14;
    break;
  case L'\x03':
    local_98 = 0x14;
    break;
  case L'\x04':
    local_98 = 0x20;
    break;
  case L'\x05':
    local_98 = 0x30;
    break;
  case L'\x06':
    local_98 = 0x40;
    break;
  default:
    archive_set_error(&a->archive,0x16,"Internal error: Unknown digest type");
    return L'\xffffffe2';
  }
  if (local_98 < 0x41) {
    local_98 = local_98 * 2;
    sVar3 = strnlen(digest,local_98 + 1);
    if (sVar3 == local_98) {
      len = 0;
      for (j = 0; j < local_98; j = j + 2) {
        wVar1 = parse_hex_nibble(digest[j]);
        wVar2 = parse_hex_nibble(digest[j + 1]);
        if ((wVar1 == L'\xffffffff') || (wVar2 == L'\xffffffff')) {
          archive_set_error(&a->archive,0x54,"invalid digest data, ignoring");
          return L'\xffffffec';
        }
        *(byte *)((long)&low + len) = (byte)(wVar1 << 4) | (byte)wVar2;
        len = len + 1;
      }
      a_local._4_4_ = archive_entry_set_digest(entry,type,(uchar *)&low);
    }
    else {
      archive_set_error(&a->archive,0x54,"incorrect digest length, ignoring");
      a_local._4_4_ = L'\xffffffec';
    }
  }
  else {
    archive_set_error(&a->archive,0x16,"Internal error: Digest storage too large");
    a_local._4_4_ = L'\xffffffe2';
  }
  return a_local._4_4_;
}

Assistant:

static int
parse_digest(struct archive_read *a, struct archive_entry *entry,
    const char *digest, int type)
{
	unsigned char digest_buf[64];
	int high, low;
	size_t i, j, len;

	switch (type) {
	case ARCHIVE_ENTRY_DIGEST_MD5:
		len = sizeof(entry->digest.md5);
		break;
	case ARCHIVE_ENTRY_DIGEST_RMD160:
		len = sizeof(entry->digest.rmd160);
		break;
	case ARCHIVE_ENTRY_DIGEST_SHA1:
		len = sizeof(entry->digest.sha1);
		break;
	case ARCHIVE_ENTRY_DIGEST_SHA256:
		len = sizeof(entry->digest.sha256);
		break;
	case ARCHIVE_ENTRY_DIGEST_SHA384:
		len = sizeof(entry->digest.sha384);
		break;
	case ARCHIVE_ENTRY_DIGEST_SHA512:
		len = sizeof(entry->digest.sha512);
		break;
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
			"Internal error: Unknown digest type");
		return ARCHIVE_FATAL;
	}

	if (len > sizeof(digest_buf)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
			"Internal error: Digest storage too large");
		return ARCHIVE_FATAL;
	}

	len *= 2;

	if (mtree_strnlen(digest, len+1) != len) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				  "incorrect digest length, ignoring");
		return ARCHIVE_WARN;
	}

	for (i = 0, j = 0; i < len; i += 2, j++) {
		high = parse_hex_nibble(digest[i]);
		low = parse_hex_nibble(digest[i+1]);
		if (high == -1 || low == -1) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
					  "invalid digest data, ignoring");
			return ARCHIVE_WARN;
		}

		digest_buf[j] = high << 4 | low;
	}

	return archive_entry_set_digest(entry, type, digest_buf);
}